

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

uint64_t extract_pkg_name(char *path)

{
  int iVar1;
  uint64_t uVar2;
  size_t local_40;
  size_t stop;
  size_t actual_length;
  char *start;
  int last_dot;
  int last_path;
  size_t length;
  char *path_local;
  
  local_40 = strlen(path);
  iVar1 = rfind(path,'/');
  start._0_4_ = rfind(path,'.');
  if ((iVar1 != -1) && ((int)start < iVar1)) {
    start._0_4_ = -1;
  }
  actual_length = (size_t)path;
  if ((iVar1 != -1) || (stop = local_40, (int)start != -1)) {
    if (iVar1 == -1) {
      stop = (size_t)(int)start;
    }
    else {
      if ((int)start != -1) {
        local_40 = (size_t)(int)start;
      }
      if (local_40 - (long)iVar1 < 2) {
        return 0xffffffffffffffff;
      }
      actual_length = (size_t)(path + (iVar1 + 1));
      stop = (local_40 - (long)iVar1) - 1;
    }
  }
  uVar2 = hash_string((char *)actual_length,stop);
  return uVar2;
}

Assistant:

uint64_t extract_pkg_name(char *path) {
	// Find the last path component
	size_t length = strlen(path);
	int last_path = rfind(path, '/');

	// Find the last `.` for the file extension
	int last_dot = rfind(path, '.');
	if (last_path != -1 && last_dot < last_path) {
		// The dot is before the final path component, so there's no file
		// extension
		last_dot = -1;
	}

	char *start;
	size_t actual_length;
	if (last_path == -1 && last_dot == -1) {
		// No path components and no file extension, the path itself is the name
		start = path;
		actual_length = length;
	} else if (last_path == -1) {
		// File extension, but no path components
		start = path;
		actual_length = (size_t) last_dot;
	} else {
		// Stop before the file extension if one exists
		size_t stop = length;
		if (last_dot != -1) {
			stop = (size_t) last_dot;
		}

		// Extract the last component into a new string
		if (stop - last_path <= 1) {
			return ~((uint64_t) 0);
		}
		start = &path[last_path + 1];
		actual_length = stop - last_path - 1;
	}

	return hash_string(start, actual_length);
}